

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_interpreted.cpp
# Opt level: O1

void __thiscall
randomx::InterpretedVm<randomx::LargePageAllocator,_false>::execute
          (InterpretedVm<randomx::LargePageAllocator,_false> *this)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  ulong uVar6;
  uint i_2;
  uint i_1;
  uint ic;
  int iVar7;
  InstructionByteCode *ibc;
  uint uVar8;
  Instruction *instr;
  ulong uVar9;
  uint i;
  addr_t aVar10;
  long lVar11;
  ulong uVar12;
  NativeRegisterFile nreg;
  ulong local_138;
  ulong uStack_130;
  int_reg_t local_128;
  int_reg_t iStack_120;
  int_reg_t local_118;
  int_reg_t iStack_110;
  int_reg_t local_108;
  int_reg_t iStack_100;
  double local_f8 [17];
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  local_108 = 0;
  iStack_100 = 0;
  local_118 = 0;
  iStack_110 = 0;
  local_128 = 0;
  iStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_f8[0x10] =
       (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.a[0].lo;
  dStack_70 = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.a[0].hi;
  local_68 = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.a[1].lo;
  dStack_60 = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.a[1].hi;
  local_58 = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.a[2].lo;
  dStack_50 = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.a[2].hi;
  local_48 = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.a[3].lo;
  dStack_40 = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.a[3].hi;
  *(undefined4 *)
   &(this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.field_0xc70 =
       0xffffffff;
  *(undefined4 *)
   &(this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.field_0xc74 =
       0xffffffff;
  *(undefined4 *)
   &(this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.field_0xc78 =
       0xffffffff;
  *(undefined4 *)
   &(this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.field_0xc7c =
       0xffffffff;
  *(undefined4 *)&this->field_0xc80 = 0xffffffff;
  *(undefined4 *)&this->field_0xc84 = 0xffffffff;
  *(undefined4 *)&this->field_0xc88 = 0xffffffff;
  *(undefined4 *)&this->field_0xc8c = 0xffffffff;
  *(ulong **)&this->field_0xc90 = &local_138;
  instr = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.program.
          programBuffer;
  lVar11 = 0;
  ibc = this->bytecode;
  do {
    BytecodeMachine::compileInstruction
              ((BytecodeMachine *)
               &(this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.
                field_0xc70,instr,(int)lVar11,ibc);
    lVar11 = lVar11 + 1;
    ibc = ibc + 1;
    instr = instr + 1;
  } while (lVar11 != 0x140);
  aVar10 = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.mem.mx;
  uVar8 = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.mem.ma;
  iVar7 = 0;
  do {
    uVar9 = (&local_138)
            [(this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.config.
             readReg1];
    uVar4 = (&local_138)
            [(this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.config.
             readReg0];
    uVar12 = (ulong)((aVar10 ^ (uint)(uVar9 ^ uVar4)) & 0x1fffc0);
    puVar5 = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.scratchpad;
    lVar11 = 0;
    do {
      (&local_138)[lVar11] = (&local_138)[lVar11] ^ *(ulong *)(puVar5 + lVar11 * 8 + uVar12);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 8);
    uVar9 = (ulong)(((uint)((uVar9 ^ uVar4) >> 0x20) ^ uVar8) & 0x1fffc0);
    puVar5 = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.scratchpad;
    lVar11 = 0;
    do {
      uVar2 = *(undefined8 *)(puVar5 + lVar11 + uVar9);
      *(double *)((long)local_f8 + lVar11 * 2) = (double)(int)uVar2;
      *(double *)((long)local_f8 + lVar11 * 2 + 8) = (double)(int)((ulong)uVar2 >> 0x20);
      lVar11 = lVar11 + 8;
    } while (lVar11 != 0x20);
    puVar5 = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.scratchpad;
    uVar4 = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.config.eMask
            [0];
    uVar6 = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.config.eMask
            [1];
    lVar11 = 0x40;
    do {
      uVar2 = *(undefined8 *)(puVar5 + lVar11 + (uVar9 - 0x20));
      *(ulong *)((long)&local_138 + lVar11 * 2) =
           (ulong)(double)(int)uVar2 & 0xffffffffffffff | uVar4;
      *(ulong *)((long)&uStack_130 + lVar11 * 2) =
           (ulong)(double)(int)((ulong)uVar2 >> 0x20) & 0xffffffffffffff | uVar6;
      lVar11 = lVar11 + 8;
    } while (lVar11 != 0x60);
    BytecodeMachine::executeBytecode
              (this->bytecode,
               (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.scratchpad,
               &(this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.config);
    uVar8 = ((uint)(&local_138)
                   [(this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.config
                    .readReg3] ^
             (uint)(&local_138)
                   [(this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.config
                    .readReg2] ^
            (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.mem.mx) &
            0x7fffffc0;
    (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.mem.mx = uVar8;
    (*(this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm._vptr_randomx_vm[10]
    )(this,(ulong)uVar8 +
           (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.datasetOffset);
    (*(this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm._vptr_randomx_vm[9])
              (this,(ulong)(this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm
                           .mem.ma +
                    (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.
                    datasetOffset,&local_138);
    uVar1 = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.mem.mx;
    uVar3 = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.mem.ma;
    (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.mem.mx = uVar3;
    (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.mem.ma = uVar1;
    lVar11 = 0;
    do {
      *(ulong *)((this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.
                 scratchpad + lVar11 * 8 + uVar9) = (&local_138)[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 8);
    lVar11 = 0x40;
    do {
      uVar9 = *(ulong *)((long)local_f8 + lVar11 + 8);
      *(ulong *)((long)&local_138 + lVar11) =
           *(ulong *)((long)local_f8 + lVar11) ^ *(ulong *)((long)&local_138 + lVar11);
      *(ulong *)((long)&uStack_130 + lVar11) = uVar9 ^ *(ulong *)((long)&uStack_130 + lVar11);
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x80);
    lVar11 = 0;
    do {
      uVar2 = *(undefined8 *)((long)local_f8 + lVar11 + 8);
      puVar5 = (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.scratchpad
               + lVar11 + uVar12;
      *(undefined8 *)puVar5 = *(undefined8 *)((long)local_f8 + lVar11);
      *(undefined8 *)(puVar5 + 8) = uVar2;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x40);
    iVar7 = iVar7 + 1;
    uVar8 = 0;
    aVar10 = 0;
  } while (iVar7 != 0x800);
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.r[6] = local_108;
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.r[7] = iStack_100;
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.r[4] = local_118;
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.r[5] = iStack_110;
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.r[2] = local_128;
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.r[3] = iStack_120;
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.r[0] = local_138;
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.r[1] = uStack_130;
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.f[0].lo =
       local_f8[0];
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.f[0].hi =
       local_f8[1];
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.f[1].lo =
       local_f8[2];
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.f[1].hi =
       local_f8[3];
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.f[2].lo =
       local_f8[4];
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.f[2].hi =
       local_f8[5];
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.f[3].lo =
       local_f8[6];
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.f[3].hi =
       local_f8[7];
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.e[0].lo =
       local_f8[8];
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.e[0].hi =
       local_f8[9];
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.e[1].lo =
       local_f8[10];
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.e[1].hi =
       local_f8[0xb];
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.e[2].lo =
       local_f8[0xc];
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.e[2].hi =
       local_f8[0xd];
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.e[3].lo =
       local_f8[0xe];
  (this->super_VmBase<randomx::LargePageAllocator,_false>).super_randomx_vm.reg.e[3].hi =
       local_f8[0xf];
  return;
}

Assistant:

void InterpretedVm<Allocator, softAes>::execute() {

		NativeRegisterFile nreg;

		for(unsigned i = 0; i < RegisterCountFlt; ++i)
			nreg.a[i] = rx_load_vec_f128(&reg.a[i].lo);

		compileProgram(program, bytecode, nreg);

		uint32_t spAddr0 = mem.mx;
		uint32_t spAddr1 = mem.ma;

		for(unsigned ic = 0; ic < RANDOMX_PROGRAM_ITERATIONS; ++ic) {
			uint64_t spMix = nreg.r[config.readReg0] ^ nreg.r[config.readReg1];
			spAddr0 ^= spMix;
			spAddr0 &= ScratchpadL3Mask64;
			spAddr1 ^= spMix >> 32;
			spAddr1 &= ScratchpadL3Mask64;
			
			for (unsigned i = 0; i < RegistersCount; ++i)
				nreg.r[i] ^= load64(scratchpad + spAddr0 + 8 * i);

			for (unsigned i = 0; i < RegisterCountFlt; ++i)
				nreg.f[i] = rx_cvt_packed_int_vec_f128(scratchpad + spAddr1 + 8 * i);

			for (unsigned i = 0; i < RegisterCountFlt; ++i)
				nreg.e[i] = maskRegisterExponentMantissa(config, rx_cvt_packed_int_vec_f128(scratchpad + spAddr1 + 8 * (RegisterCountFlt + i)));

			executeBytecode(bytecode, scratchpad, config);

			mem.mx ^= nreg.r[config.readReg2] ^ nreg.r[config.readReg3];
			mem.mx &= CacheLineAlignMask;
			datasetPrefetch(datasetOffset + mem.mx);
			datasetRead(datasetOffset + mem.ma, nreg.r);
			std::swap(mem.mx, mem.ma);

			for (unsigned i = 0; i < RegistersCount; ++i)
				store64(scratchpad + spAddr1 + 8 * i, nreg.r[i]);

			for (unsigned i = 0; i < RegisterCountFlt; ++i)
				nreg.f[i] = rx_xor_vec_f128(nreg.f[i], nreg.e[i]);

			for (unsigned i = 0; i < RegisterCountFlt; ++i)
				rx_store_vec_f128((double*)(scratchpad + spAddr0 + 16 * i), nreg.f[i]);

			spAddr0 = 0;
			spAddr1 = 0;
		}

		for (unsigned i = 0; i < RegistersCount; ++i)
			store64(&reg.r[i], nreg.r[i]);

		for (unsigned i = 0; i < RegisterCountFlt; ++i)
			rx_store_vec_f128(&reg.f[i].lo, nreg.f[i]);

		for (unsigned i = 0; i < RegisterCountFlt; ++i)
			rx_store_vec_f128(&reg.e[i].lo, nreg.e[i]);
	}